

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddCallback(ImDrawList *this,ImDrawCallback callback,void *callback_data)

{
  void *in_RDX;
  ImDrawCallback in_RSI;
  ImVector<ImDrawCmd> *in_RDI;
  ImDrawList *in_stack_00000010;
  ImDrawCmd *current_cmd;
  ImDrawCmd *local_30;
  ImDrawCmd *local_20;
  
  if (in_RDI->Size == 0) {
    local_30 = (ImDrawCmd *)0x0;
  }
  else {
    local_30 = ImVector<ImDrawCmd>::back(in_RDI);
  }
  local_20 = local_30;
  if (((local_30 == (ImDrawCmd *)0x0) || (local_30->ElemCount != 0)) ||
     (local_30->UserCallback != (ImDrawCallback)0x0)) {
    AddDrawCmd(in_stack_00000010);
    local_20 = ImVector<ImDrawCmd>::back(in_RDI);
  }
  local_20->UserCallback = in_RSI;
  local_20->UserCallbackData = in_RDX;
  AddDrawCmd(in_stack_00000010);
  return;
}

Assistant:

void ImDrawList::AddCallback(ImDrawCallback callback, void* callback_data)
{
    ImDrawCmd* current_cmd = CmdBuffer.Size ? &CmdBuffer.back() : NULL;
    if (!current_cmd || current_cmd->ElemCount != 0 || current_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        current_cmd = &CmdBuffer.back();
    }
    current_cmd->UserCallback = callback;
    current_cmd->UserCallbackData = callback_data;

    AddDrawCmd(); // Force a new command after us (see comment below)
}